

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::InitializePipelineDesc
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          GraphicsPipelineStateCreateInfo *CreateInfo,FixedLinearAllocator *MemPool)

{
  GraphicsPipelineData *pGVar1;
  bool bVar2;
  int iVar3;
  GraphicsPipelineData *pGVar4;
  Char *pCVar5;
  RenderDeviceVkImpl *this_00;
  RenderDeviceInfo *pRVar6;
  IRenderPass *pIVar7;
  undefined4 extraout_var;
  RenderPassVkImpl *this_01;
  SubpassDesc *pSVar8;
  char *__src;
  size_type sVar9;
  uint *puVar10;
  size_t sVar11;
  RefCntAutoPtr<Diligent::IRenderPass> *this_02;
  Uint8 *pUVar12;
  char (*Args_1) [32];
  undefined1 local_158 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> Strides;
  string msg_4;
  LayoutElement *SrcElem;
  size_t Elem;
  LayoutElement *pLayoutElements;
  InputLayoutDesc *InputLayout;
  string msg_3;
  AttachmentReference *DSAttachmentRef;
  string msg_2;
  AttachmentReference *RTAttachmentRef;
  Uint32 rt;
  SubpassDesc *Subpass;
  string msg_1;
  RenderPassDesc *RPDesc;
  Uint32 **pStrides;
  Uint8 *BufferSlotsUsed;
  RefCntAutoPtr<Diligent::IRenderPass> *pRenderPass;
  GraphicsPipelineDesc *GraphicsPipeline;
  undefined1 local_48 [8];
  string msg;
  void *Ptr;
  FixedLinearAllocator *MemPool_local;
  GraphicsPipelineStateCreateInfo *CreateInfo_local;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  pGVar4 = FixedLinearAllocator::
           Construct<Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GraphicsPipelineData>
                     (MemPool);
  (this->field_6).m_pGraphicsPipelineData = pGVar4;
  msg.field_2._8_8_ = FixedLinearAllocator::ReleaseOwnership(MemPool);
  if ((GraphicsPipelineData *)msg.field_2._8_8_ != (this->field_6).m_pGraphicsPipelineData) {
    FormatString<char[26],char[29]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Ptr == m_pPipelineDataRawMem",(char (*) [29])this);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"InitializePipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x3b7);
    std::__cxx11::string::~string((string *)local_48);
  }
  pGVar4 = (this->field_6).m_pGraphicsPipelineData;
  this_02 = &((this->field_6).m_pGraphicsPipelineData)->pRenderPass;
  pUVar12 = &((this->field_6).m_pGraphicsPipelineData)->BufferSlotsUsed;
  pGVar1 = (this->field_6).m_pGraphicsPipelineData;
  memcpy(pGVar4,&CreateInfo->GraphicsPipeline,0xbc);
  this_00 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                       );
  pRVar6 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetDeviceInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this_00);
  CorrectGraphicsPipelineDesc(&pGVar4->Desc,&pRVar6->Features);
  CopyResourceLayout(&(CreateInfo->super_PipelineStateCreateInfo).PSODesc.ResourceLayout,
                     &(this->
                      super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                      ).m_Desc.ResourceLayout,MemPool);
  CopyResourceSignatures(this,&CreateInfo->super_PipelineStateCreateInfo,MemPool);
  RefCntAutoPtr<Diligent::IRenderPass>::operator=(this_02,(pGVar4->Desc).pRenderPass);
  bVar2 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)this_02);
  if (bVar2) {
    pIVar7 = RefCntAutoPtr<Diligent::IRenderPass>::operator->(this_02);
    iVar3 = (*(pIVar7->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    msg_1.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
    if (*(uint *)(*(char (*) [52])msg_1.field_2._8_8_ + 0x18) <= (uint)(pGVar4->Desc).SubpassIndex)
    {
      FormatString<char[26],char[52]>
                ((string *)&Subpass,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GraphicsPipeline.SubpassIndex < RPDesc.SubpassCount",
                 (char (*) [52])msg_1.field_2._8_8_);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"InitializePipelineDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x3c8);
      std::__cxx11::string::~string((string *)&Subpass);
    }
    this_01 = RefCntAutoPtr<Diligent::IRenderPass>::RawPtr<Diligent::RenderPassVkImpl>(this_02);
    pSVar8 = RenderPassBase<Diligent::EngineVkImplTraits>::GetSubpass
                       (&this_01->super_RenderPassBase<Diligent::EngineVkImplTraits>,
                        (uint)(pGVar4->Desc).SubpassIndex);
    (pGVar4->Desc).NumRenderTargets = (Uint8)pSVar8->RenderTargetAttachmentCount;
    for (RTAttachmentRef._4_4_ = 0; RTAttachmentRef._4_4_ < pSVar8->RenderTargetAttachmentCount;
        RTAttachmentRef._4_4_ = RTAttachmentRef._4_4_ + 1) {
      msg_2.field_2._8_8_ = pSVar8->pRenderTargetAttachments + RTAttachmentRef._4_4_;
      if (((AttachmentReference *)msg_2.field_2._8_8_)->AttachmentIndex != 0xffffffff) {
        if (*(uint *)(msg_1.field_2._8_8_ + 8) <=
            ((AttachmentReference *)msg_2.field_2._8_8_)->AttachmentIndex) {
          FormatString<char[26],char[57]>
                    ((string *)&DSAttachmentRef,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                     (char (*) [57])msg_1.field_2._8_8_);
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar5,"InitializePipelineDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                     ,0x3d1);
          std::__cxx11::string::~string((string *)&DSAttachmentRef);
        }
        (pGVar4->Desc).RTVFormats[RTAttachmentRef._4_4_] =
             *(TEXTURE_FORMAT *)
              (*(long *)(msg_1.field_2._8_8_ + 0x10) + (ulong)*(uint *)msg_2.field_2._8_8_ * 0x10);
      }
    }
    if ((pSVar8->pDepthStencilAttachment != (AttachmentReference *)0x0) &&
       (msg_3.field_2._8_8_ = pSVar8->pDepthStencilAttachment,
       ((AttachmentReference *)msg_3.field_2._8_8_)->AttachmentIndex != 0xffffffff)) {
      if (*(uint *)(msg_1.field_2._8_8_ + 8) <=
          ((AttachmentReference *)msg_3.field_2._8_8_)->AttachmentIndex) {
        FormatString<char[26],char[57]>
                  ((string *)&InputLayout,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount",
                   (char (*) [57])msg_1.field_2._8_8_);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"InitializePipelineDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x3db);
        std::__cxx11::string::~string((string *)&InputLayout);
      }
      (pGVar4->Desc).DSVFormat =
           *(TEXTURE_FORMAT *)
            (*(long *)(msg_1.field_2._8_8_ + 0x10) + (ulong)*(uint *)msg_3.field_2._8_8_ * 0x10);
    }
  }
  Elem = 0;
  if ((pGVar4->Desc).InputLayout.NumElements != 0) {
    Elem = (size_t)FixedLinearAllocator::ConstructArray<Diligent::LayoutElement>
                             (MemPool,(ulong)(pGVar4->Desc).InputLayout.NumElements);
    for (SrcElem = (LayoutElement *)0x0;
        SrcElem < (LayoutElement *)(ulong)(pGVar4->Desc).InputLayout.NumElements;
        SrcElem = (LayoutElement *)((long)&SrcElem->HLSLSemantic + 1)) {
      Args_1 = (char (*) [32])((long)SrcElem * 0x28);
      __src = *Args_1 + (long)(pGVar4->Desc).InputLayout.LayoutElements;
      memcpy((LayoutElement *)(Elem + SrcElem * 0x28),__src,0x28);
      if (*(long *)__src == 0) {
        FormatString<char[26],char[32]>
                  ((string *)
                   &Strides.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SrcElem.HLSLSemantic != nullptr",Args_1);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"InitializePipelineDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x3ea);
        std::__cxx11::string::~string
                  ((string *)
                   &Strides.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      pCVar5 = FixedLinearAllocator::CopyString(MemPool,*(char **)__src,0);
      ((LayoutElement *)(Elem + SrcElem * 0x28))->HLSLSemantic = pCVar5;
    }
    ResolveInputLayoutAutoOffsetsAndStrides
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158,
               (LayoutElement *)Elem,(pGVar4->Desc).InputLayout.NumElements);
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
    *pUVar12 = (Uint8)sVar9;
    puVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
    puVar10 = FixedLinearAllocator::CopyConstructArray<unsigned_int,unsigned_int>
                        (MemPool,puVar10,(ulong)*pUVar12);
    pGVar1->pStrides = puVar10;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
  }
  (pGVar4->Desc).InputLayout.LayoutElements = (LayoutElement *)Elem;
  sVar11 = ComputeRenderTargetFormatsHash
                     ((uint)(pGVar4->Desc).NumRenderTargets,(pGVar4->Desc).RTVFormats,
                      (pGVar4->Desc).DSVFormat);
  ((this->field_6).m_pGraphicsPipelineData)->dvpRenderTargetFormatsHash = sVar11;
  return;
}

Assistant:

void InitializePipelineDesc(const GraphicsPipelineStateCreateInfo& CreateInfo,
                                FixedLinearAllocator&                  MemPool)
    {
        this->m_pGraphicsPipelineData = MemPool.Construct<GraphicsPipelineData>();
        void* Ptr                     = MemPool.ReleaseOwnership();
        VERIFY_EXPR(Ptr == m_pPipelineDataRawMem);

        GraphicsPipelineDesc&       GraphicsPipeline = this->m_pGraphicsPipelineData->Desc;
        RefCntAutoPtr<IRenderPass>& pRenderPass      = this->m_pGraphicsPipelineData->pRenderPass;
        Uint8&                      BufferSlotsUsed  = this->m_pGraphicsPipelineData->BufferSlotsUsed;
        Uint32*&                    pStrides         = this->m_pGraphicsPipelineData->pStrides;

        GraphicsPipeline = CreateInfo.GraphicsPipeline;
        CorrectGraphicsPipelineDesc(GraphicsPipeline, this->GetDevice()->GetDeviceInfo().Features);

        CopyResourceLayout(CreateInfo.PSODesc.ResourceLayout, this->m_Desc.ResourceLayout, MemPool);
        CopyResourceSignatures(CreateInfo, MemPool);

        pRenderPass = GraphicsPipeline.pRenderPass;
        if (pRenderPass)
        {
            const RenderPassDesc& RPDesc = pRenderPass->GetDesc();
            VERIFY_EXPR(GraphicsPipeline.SubpassIndex < RPDesc.SubpassCount);
            const SubpassDesc& Subpass = pRenderPass.template RawPtr<RenderPassImplType>()->GetSubpass(GraphicsPipeline.SubpassIndex);

            GraphicsPipeline.NumRenderTargets = static_cast<Uint8>(Subpass.RenderTargetAttachmentCount);
            for (Uint32 rt = 0; rt < Subpass.RenderTargetAttachmentCount; ++rt)
            {
                const AttachmentReference& RTAttachmentRef = Subpass.pRenderTargetAttachments[rt];
                if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    VERIFY_EXPR(RTAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
                    GraphicsPipeline.RTVFormats[rt] = RPDesc.pAttachments[RTAttachmentRef.AttachmentIndex].Format;
                }
            }

            if (Subpass.pDepthStencilAttachment != nullptr)
            {
                const AttachmentReference& DSAttachmentRef = *Subpass.pDepthStencilAttachment;
                if (DSAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                {
                    VERIFY_EXPR(DSAttachmentRef.AttachmentIndex < RPDesc.AttachmentCount);
                    GraphicsPipeline.DSVFormat = RPDesc.pAttachments[DSAttachmentRef.AttachmentIndex].Format;
                }
            }
        }

        const InputLayoutDesc& InputLayout     = GraphicsPipeline.InputLayout;
        LayoutElement*         pLayoutElements = nullptr;
        if (InputLayout.NumElements > 0)
        {
            pLayoutElements = MemPool.ConstructArray<LayoutElement>(InputLayout.NumElements);
            for (size_t Elem = 0; Elem < InputLayout.NumElements; ++Elem)
            {
                const LayoutElement& SrcElem = InputLayout.LayoutElements[Elem];
                pLayoutElements[Elem]        = SrcElem;
                VERIFY_EXPR(SrcElem.HLSLSemantic != nullptr);
                pLayoutElements[Elem].HLSLSemantic = MemPool.CopyString(SrcElem.HLSLSemantic);
            }

            // Correct description and compute offsets and tight strides
            const std::vector<Uint32> Strides = ResolveInputLayoutAutoOffsetsAndStrides(pLayoutElements, InputLayout.NumElements);
            BufferSlotsUsed                   = static_cast<Uint8>(Strides.size());

            pStrides = MemPool.CopyConstructArray<Uint32>(Strides.data(), BufferSlotsUsed);
        }
        GraphicsPipeline.InputLayout.LayoutElements = pLayoutElements;

#ifdef DILIGENT_DEVELOPMENT
        this->m_pGraphicsPipelineData->dvpRenderTargetFormatsHash = ComputeRenderTargetFormatsHash(
            GraphicsPipeline.NumRenderTargets, GraphicsPipeline.RTVFormats, GraphicsPipeline.DSVFormat);
#endif
    }